

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

pContextStackFrame_conflict create_context_stack_frame(void)

{
  pContextStackFrame_conflict res;
  
  res = (pContextStackFrame_conflict)malloc(0x10);
  if (res == (pContextStackFrame_conflict)0x0) {
    perror("create_context_stack_frame: malloc failed");
    res = (pContextStackFrame_conflict)0x0;
  }
  else {
    res->next = (pContextStackFrame)0x0;
  }
  return res;
}

Assistant:

pContextStackFrame create_context_stack_frame()
{
    pContextStackFrame res = malloc(sizeof(ContextStackFrame));
    if (res == NULL)
    {
        perror("create_context_stack_frame: malloc failed");
        return NULL;
    }
    res->next = NULL;
    return res;
}